

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inline_pass.cpp
# Opt level: O1

unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> __thiscall
spvtools::opt::InlinePass::InlineReturn
          (InlinePass *this,
          unordered_map<unsigned_int,_unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<std::pair<const_unsigned_int,_unsigned_int>_>_>
          *callee2caller,
          vector<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
          *new_blocks,
          unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
          *new_blk_ptr,DebugInlinedAtContext *inlined_at_ctx,Function *calleeFn,Instruction *inst,
          uint32_t returnVarId)

{
  uint uVar1;
  uint **ppuVar2;
  pointer puVar3;
  __uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> _Var4;
  __uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
  _Var5;
  Instruction *pIVar6;
  IRContext *this_00;
  size_t sVar7;
  bool bVar8;
  uint32_t label_id;
  Operand *pOVar9;
  uint **ppuVar10;
  long lVar11;
  _func_int **pp_Var12;
  ulong uVar13;
  _Head_base<0UL,_spvtools::opt::BasicBlock_*,_false> _Var14;
  _Head_base<0UL,_spvtools::opt::Instruction_*,_false> _Var15;
  uint val_id;
  long *plVar16;
  Instruction *line_inst;
  undefined4 in_stack_00000014;
  uint32_t in_stack_00000018;
  size_type __dnew;
  undefined1 local_68 [40];
  IRContext *pIStack_40;
  undefined8 local_38;
  
  if (*(int *)(CONCAT44(in_stack_00000014,returnVarId) + 0x28) == 0xfe) {
    if (in_stack_00000018 == 0) {
      __assert_fail("returnVarId != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/inline_pass.cpp"
                    ,0x184,
                    "std::unique_ptr<BasicBlock> spvtools::opt::InlinePass::InlineReturn(const std::unordered_map<uint32_t, uint32_t> &, std::vector<std::unique_ptr<BasicBlock>> *, std::unique_ptr<BasicBlock>, analysis::DebugInlinedAtContext *, Function *, const Instruction *, uint32_t)"
                   );
    }
    pOVar9 = Instruction::GetInOperand((Instruction *)CONCAT44(in_stack_00000014,returnVarId),0);
    ppuVar2 = (uint **)(pOVar9->words).large_data_._M_t.
                       super___uniq_ptr_impl<std::vector<unsigned_int,_std::allocator<unsigned_int>_>,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_std::default_delete<std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>_>
                       .
                       super__Head_base<0UL,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_*,_false>
                       ._M_head_impl;
    ppuVar10 = &(pOVar9->words).small_data_;
    if (ppuVar2 != (uint **)0x0) {
      ppuVar10 = ppuVar2;
    }
    val_id = **ppuVar10;
    puVar3 = (new_blocks->
             super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    uVar13 = (ulong)val_id % (ulong)puVar3;
    _Var4._M_t.
    super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
    .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl =
         (new_blocks->
         super__Vector_base<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>,_std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>_>_>
         )._M_impl.super__Vector_impl_data._M_start[uVar13]._M_t.
         super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
         ._M_t;
    _Var14._M_head_impl = (BasicBlock *)0x0;
    if (((_Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
          )_Var4._M_t.
           super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
           .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl !=
         (BasicBlock *)0x0) &&
       (_Var15._M_head_impl =
             *(Instruction **)
              _Var4._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
              .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
       _Var14._M_head_impl =
            (BasicBlock *)
            _Var4._M_t.
            super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
            .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl,
       val_id != *(uint *)&((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                             *)((long)_Var15._M_head_impl + 8))->
                           super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
       )) {
      while (_Var5._M_t.
             super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
             .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl =
                  *(tuple<spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                    *)&((unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
                         *)&(_Var15._M_head_impl)->
                            super_IntrusiveNodeBase<spvtools::opt::Instruction>)->_M_t,
            (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             )_Var5._M_t.
              super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
              .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl !=
            (__uniq_ptr_impl<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>
             )0x0) {
        uVar1 = *(uint *)&((vector<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
                            *)((long)_Var5._M_t.
                                     super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                                     .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>.
                                     _M_head_impl + 8))->
                          super__Vector_base<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>,_std::allocator<std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>_>_>
        ;
        _Var14._M_head_impl = (BasicBlock *)0x0;
        if (((ulong)uVar1 % (ulong)puVar3 != uVar13) ||
           (_Var14._M_head_impl = (BasicBlock *)_Var15,
           _Var15._M_head_impl =
                (Instruction *)
                _Var5._M_t.
                super__Tuple_impl<0UL,_spvtools::opt::Instruction_*,_std::default_delete<spvtools::opt::Instruction>_>
                .super__Head_base<0UL,_spvtools::opt::Instruction_*,_false>._M_head_impl,
           val_id == uVar1)) goto LAB_0058c0a1;
      }
      _Var14._M_head_impl = (BasicBlock *)0x0;
    }
LAB_0058c0a1:
    if ((_Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>)_Var14._M_head_impl ==
        (_Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>)0x0) {
      lVar11 = 0;
    }
    else {
      lVar11 = (long)(_Var14._M_head_impl)->function_;
    }
    if (lVar11 != 0) {
      val_id = *(uint32_t *)(lVar11 + 0xc);
    }
    pIVar6 = *(Instruction **)(CONCAT44(in_stack_00000014,returnVarId) + 0x50);
    line_inst = (Instruction *)0x0;
    if (pIVar6 != *(Instruction **)(CONCAT44(in_stack_00000014,returnVarId) + 0x58)) {
      line_inst = pIVar6;
    }
    this_00 = (IRContext *)(callee2caller->_M_h)._M_rehash_policy._M_next_resize;
    if ((this_00->valid_analyses_ & kAnalysisDebugInfo) == kAnalysisNone) {
      IRContext::BuildDebugInfoManager(this_00);
    }
    local_68._0_8_ =
         analysis::DebugInfoManager::BuildDebugScope
                   ((this_00->debug_info_mgr_)._M_t.
                    super___uniq_ptr_impl<spvtools::opt::analysis::DebugInfoManager,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_std::default_delete<spvtools::opt::analysis::DebugInfoManager>_>
                    .super__Head_base<0UL,_spvtools::opt::analysis::DebugInfoManager_*,_false>.
                    _M_head_impl,(DebugScope *)(CONCAT44(in_stack_00000014,returnVarId) + 0x68),
                    (DebugInlinedAtContext *)calleeFn);
    AddStore((InlinePass *)callee2caller,in_stack_00000018,val_id,
             (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
              *)inlined_at_ctx,line_inst,(DebugScope *)local_68);
  }
  plVar16 = *(long **)&inst[1].opcode_;
  label_id = 0;
  do {
    if (plVar16 == *(long **)&inst[1].unique_id_) {
LAB_0058c237:
      if (label_id == 0) {
        (this->super_Pass)._vptr_Pass = (_func_int **)inlined_at_ctx->call_inst_line_;
        inlined_at_ctx->call_inst_line_ = (Instruction *)0x0;
      }
      else {
        if (*(int *)(CONCAT44(in_stack_00000014,returnVarId) + 0x28) - 0xfdU < 2) {
          AddBranch((InlinePass *)callee2caller,label_id,
                    (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                     *)inlined_at_ctx);
        }
        std::
        vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
        ::
        emplace_back<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>
                  ((vector<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>,std::allocator<std::unique_ptr<spvtools::opt::BasicBlock,std::default_delete<spvtools::opt::BasicBlock>>>>
                    *)new_blk_ptr,
                   (unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
                    *)inlined_at_ctx);
        NewLabel((InlinePass *)local_68,(uint32_t)callee2caller);
        pp_Var12 = (_func_int **)operator_new(0x88);
        *pp_Var12 = (_func_int *)0x0;
        ((DebugScope *)(pp_Var12 + 1))->lexical_scope_ = local_68._0_4_;
        ((DebugScope *)(pp_Var12 + 1))->inlined_at_ = local_68._4_4_;
        pp_Var12[4] = (_func_int *)0x0;
        pp_Var12[5] = (_func_int *)0x0;
        pp_Var12[3] = (_func_int *)&PTR__Instruction_00b15d30;
        *(undefined4 *)(pp_Var12 + 9) = 0;
        pp_Var12[7] = (_func_int *)0x0;
        *(undefined8 *)((long)pp_Var12 + 0x3e) = 0;
        pp_Var12[10] = (_func_int *)0x0;
        pp_Var12[0xb] = (_func_int *)0x0;
        pp_Var12[0xc] = (_func_int *)0x0;
        pp_Var12[0xd] = (_func_int *)0x0;
        pp_Var12[0xe] = (_func_int *)0x0;
        pp_Var12[0xf] = (_func_int *)0x0;
        pp_Var12[0x10] = (_func_int *)0x0;
        pp_Var12[4] = (_func_int *)(pp_Var12 + 3);
        pp_Var12[5] = (_func_int *)(pp_Var12 + 3);
        *(undefined1 *)(pp_Var12 + 6) = 1;
        pp_Var12[2] = (_func_int *)&PTR__InstructionList_00b15dc8;
        (this->super_Pass)._vptr_Pass = pp_Var12;
      }
      return (__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
              )(__uniq_ptr_data<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>,_true,_true>
                )this;
    }
    lVar11 = *(long *)(*plVar16 + 0x20);
    if ((lVar11 == 0) || (*(char *)(lVar11 + 0x18) != '\0')) {
      __assert_fail("!insts_.empty()",
                    "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/SPIRV-Tools/source/opt/basic_block.h"
                    ,0x78,"iterator spvtools::opt::BasicBlock::tail()");
    }
    bVar8 = spvOpcodeIsAbort(*(Op *)(*(long *)(*plVar16 + 0x28) + 0x28));
    if (bVar8) {
      sVar7 = (callee2caller->_M_h)._M_rehash_policy._M_next_resize;
      label_id = Module::TakeNextIdBound(*(Module **)(sVar7 + 0x30));
      if ((label_id == 0) && (*(long *)(sVar7 + 0x48) != 0)) {
        local_68._0_8_ = (long)local_68 + 0x10;
        local_68._32_8_ = (_Invoker_type)0x25;
        local_68._0_8_ = std::__cxx11::string::_M_create((ulong *)local_68,(ulong)(local_68 + 0x20))
        ;
        local_68._16_8_ = local_68._32_8_;
        *(undefined8 *)local_68._0_8_ = 0x667265766f204449;
        builtin_strncpy((char *)(local_68._0_8_ + 8),"low. Try",8);
        builtin_strncpy((char *)(local_68._0_8_ + 0x10)," running",8);
        builtin_strncpy((char *)(local_68._0_8_ + 0x18)," compact",8);
        *(undefined8 *)(local_68._0_8_ + 0x1d) = 0x2e7364692d746361;
        local_68._8_8_ = local_68._32_8_;
        *(undefined1 *)(local_68._32_8_ + local_68._0_8_) = 0;
        local_68._32_8_ = (_Invoker_type)0x0;
        pIStack_40 = (IRContext *)0x0;
        local_38._0_1_ = false;
        local_38._1_7_ = 0;
        std::
        function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>::
        operator()((function<void_(spv_message_level_t,_const_char_*,_const_spv_position_t_&,_const_char_*)>
                    *)(sVar7 + 0x38),SPV_MSG_ERROR,"",(spv_position_t *)(local_68 + 0x20),
                   (char *)local_68._0_8_);
        if (local_68._0_8_ != (long)local_68 + 0x10) {
          operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
        }
      }
      goto LAB_0058c237;
    }
    plVar16 = plVar16 + 1;
  } while( true );
}

Assistant:

std::unique_ptr<BasicBlock> InlinePass::InlineReturn(
    const std::unordered_map<uint32_t, uint32_t>& callee2caller,
    std::vector<std::unique_ptr<BasicBlock>>* new_blocks,
    std::unique_ptr<BasicBlock> new_blk_ptr,
    analysis::DebugInlinedAtContext* inlined_at_ctx, Function* calleeFn,
    const Instruction* inst, uint32_t returnVarId) {
  // Store return value to return variable.
  if (inst->opcode() == spv::Op::OpReturnValue) {
    assert(returnVarId != 0);
    uint32_t valId = inst->GetInOperand(kSpvReturnValueId).words[0];
    const auto mapItr = callee2caller.find(valId);
    if (mapItr != callee2caller.end()) {
      valId = mapItr->second;
    }
    AddStore(returnVarId, valId, &new_blk_ptr, inst->dbg_line_inst(),
             context()->get_debug_info_mgr()->BuildDebugScope(
                 inst->GetDebugScope(), inlined_at_ctx));
  }

  uint32_t returnLabelId = 0;
  for (auto callee_block_itr = calleeFn->begin();
       callee_block_itr != calleeFn->end(); ++callee_block_itr) {
    if (spvOpcodeIsAbort(callee_block_itr->tail()->opcode())) {
      returnLabelId = context()->TakeNextId();
      break;
    }
  }
  if (returnLabelId == 0) return new_blk_ptr;

  if (inst->opcode() == spv::Op::OpReturn ||
      inst->opcode() == spv::Op::OpReturnValue)
    AddBranch(returnLabelId, &new_blk_ptr);
  new_blocks->push_back(std::move(new_blk_ptr));
  return MakeUnique<BasicBlock>(NewLabel(returnLabelId));
}